

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

QVariant *
variantMapValueForKeyPath(QVariant *__return_storage_ptr__,QVariant *value,QStringList *keyPath)

{
  byte bVar1;
  bool bVar2;
  qsizetype qVar3;
  QString *pQVar4;
  QList<QString> local_68;
  undefined1 local_40 [8];
  QVariant firstValue;
  QStringList *keyPath_local;
  QVariant *value_local;
  
  firstValue.d._24_8_ = keyPath;
  qVar3 = QList<QString>::count(keyPath);
  if (qVar3 < 2) {
    bVar2 = QList<QString>::isEmpty(keyPath);
    if (bVar2) {
      QVariant::QVariant(__return_storage_ptr__);
    }
    else {
      pQVar4 = QList<QString>::first(keyPath);
      variantMapValue(__return_storage_ptr__,value,pQVar4);
    }
  }
  else {
    pQVar4 = QList<QString>::first(keyPath);
    variantMapValue((QVariant *)local_40,value,pQVar4);
    bVar1 = QVariant::isNull();
    if ((bVar1 & 1) == 0) {
      QList<QString>::mid(&local_68,keyPath,1,-1);
      variantMapValueForKeyPath(__return_storage_ptr__,(QVariant *)local_40,&local_68);
      QList<QString>::~QList(&local_68);
    }
    else {
      QVariant::QVariant(__return_storage_ptr__);
    }
    QVariant::~QVariant((QVariant *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant variantMapValueForKeyPath(const QVariant& value, const QStringList keyPath)
{
	if (keyPath.count() > 1) {
		QVariant firstValue = variantMapValue(value, keyPath.first());
		return firstValue.isNull() ? QVariant() : variantMapValueForKeyPath(firstValue, keyPath.mid(1));
	} else if (!keyPath.isEmpty()) {
		return variantMapValue(value, keyPath.first());
	}
	return QVariant();
}